

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_free(global_State *g,lua_State *L)

{
  undefined4 uVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  TValue *in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  
  lj_func_closeuv(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar1 = *(undefined4 *)(in_RSI + 0x24);
  lVar2 = (ulong)*(uint *)(in_RSI + 0x38) << 3;
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - (int)lVar2;
  (**(code **)(in_RDI + 0x10))(*(undefined8 *)(in_RDI + 0x18),uVar1,lVar2,0);
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -0x40;
  (**(code **)(in_RDI + 0x10))(*(undefined8 *)(in_RDI + 0x18),in_RSI,0x40,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_state_free(global_State *g, lua_State *L)
{
  lua_assert(L != mainthread(g));
  lj_func_closeuv(L, tvref(L->stack));
  lua_assert(gcref(L->openupval) == NULL);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lj_mem_freet(g, L);
}